

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

void __thiscall cmServerResponse::SetData(cmServerResponse *this,Value *data)

{
  bool bVar1;
  Value *pVVar2;
  allocator local_61;
  string local_60;
  Value local_40;
  
  if (this->m_Payload != PAYLOAD_UNKNOWN) {
    __assert_fail("this->m_Payload == PAYLOAD_UNKNOWN",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx"
                  ,0xb0,"void cmServerResponse::SetData(const Json::Value &)");
  }
  pVVar2 = Json::Value::operator[](data,&kCOOKIE_KEY_abi_cxx11_);
  bVar1 = Json::Value::isNull(pVVar2);
  if (bVar1) {
    pVVar2 = Json::Value::operator[](data,&kTYPE_KEY_abi_cxx11_);
    bVar1 = Json::Value::isNull(pVVar2);
    if (bVar1) {
      this->m_Payload = PAYLOAD_DATA;
      Json::Value::Value(&local_40,data);
      Json::Value::operator=(&this->m_Data,&local_40);
      Json::Value::~Value(&local_40);
      return;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_60,"Response contains cookie or type field.",&local_61);
  SetError(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmServerResponse::SetData(const Json::Value& data)
{
  assert(this->m_Payload == PAYLOAD_UNKNOWN);
  if (!data[kCOOKIE_KEY].isNull() || !data[kTYPE_KEY].isNull()) {
    this->SetError("Response contains cookie or type field.");
    return;
  }
  this->m_Payload = PAYLOAD_DATA;
  this->m_Data = data;
}